

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorT_inc.hh
# Opt level: O0

vector_type * __thiscall
OpenMesh::VectorT<double,_3>::operator*
          (vector_type *__return_storage_ptr__,VectorT<double,_3> *this,double *_s)

{
  double *_s_local;
  VectorT<double,_3> *this_local;
  
  VectorT(__return_storage_ptr__,(this->super_VectorDataT<double,_3>).values_[0] * *_s,
          (this->super_VectorDataT<double,_3>).values_[1] * *_s,
          (this->super_VectorDataT<double,_3>).values_[2] * *_s);
  return __return_storage_ptr__;
}

Assistant:

inline vector_type operator*(const Scalar& _s) const {
#if DIM==N
    return vector_type(*this) *= _s;
#else
#define expr(i) Base::values_[i] * _s
    return vector_type(unroll_csv(expr));
#undef expr
#endif
  }